

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

string * __thiscall
phosg::freadx_abi_cxx11_(string *__return_storage_ptr__,phosg *this,FILE *f,size_t size)

{
  size_t f_00;
  char *data;
  allocator<char> local_22;
  undefined1 local_21;
  FILE *local_20;
  size_t size_local;
  FILE *f_local;
  string *ret;
  
  local_21 = 0;
  local_20 = f;
  size_local = (size_t)this;
  f_local = (FILE *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(size_type)f,'\0',&local_22);
  ::std::allocator<char>::~allocator(&local_22);
  f_00 = size_local;
  data = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__);
  freadx((FILE *)f_00,data,(size_t)local_20);
  return __return_storage_ptr__;
}

Assistant:

string freadx(FILE* f, size_t size) {
  string ret(size, 0);
  freadx(f, ret.data(), size);
  return ret;
}